

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O0

REF_STATUS ref_dict_location(REF_DICT ref_dict,REF_INT key,REF_INT *location)

{
  int local_2c;
  REF_INT i;
  REF_INT *location_local;
  REF_INT key_local;
  REF_DICT ref_dict_local;
  
  if (ref_dict->n < 0xb) {
    *location = -1;
    for (local_2c = 0; local_2c < ref_dict->n; local_2c = local_2c + 1) {
      if (key == ref_dict->key[local_2c]) {
        *location = local_2c;
        return 0;
      }
    }
    ref_dict_local._4_4_ = 5;
  }
  else {
    ref_dict_local._4_4_ = ref_sort_search_int(ref_dict->n,ref_dict->key,key,location);
  }
  return ref_dict_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_dict_location(REF_DICT ref_dict, REF_INT key,
                                     REF_INT *location) {
  REF_INT i;

  if (10 < ref_dict_n(ref_dict)) {
    return ref_sort_search_int(ref_dict_n(ref_dict), ref_dict->key, key,
                               location);
  } else {
    *location = REF_EMPTY;

    for (i = 0; i < ref_dict_n(ref_dict); i++)
      if (key == ref_dict->key[i]) {
        *location = i;
        return REF_SUCCESS;
      }
  }
  return REF_NOT_FOUND;
}